

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_storage.cpp
# Opt level: O0

ssize_t __thiscall
libtorrent::aux::posix_storage::write(posix_storage *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  file_storage *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  undefined4 in_R8D;
  int in_R9D;
  span<const_char> buf;
  int in_stack_00000008;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff90;
  file_storage *local_48;
  undefined8 local_40;
  piece_index_t local_34;
  undefined8 uStack_30;
  int offset_local;
  settings_interface *param_1_local;
  posix_storage *this_local;
  undefined1 auStack_18 [4];
  piece_index_t piece_local;
  span<const_char> buffer_local;
  
  uStack_30 = CONCAT44(in_register_00000034,__fd);
  local_34.m_val = in_R9D;
  param_1_local = (settings_interface *)this;
  this_local._4_4_ = in_R8D;
  _auStack_18 = (char *)__buf;
  this_00 = files(this);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_48,(span<const_char> *)auStack_18);
  buf.m_len._0_4_ = this_local._4_4_;
  buf.m_ptr = (char *)local_40;
  buf.m_len._4_4_ = 0;
  iVar1 = readwrite<libtorrent::aux::posix_storage::write(libtorrent::settings_interface_const&,libtorrent::span<char_const>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::storage_error&)::__0>
                    ((aux *)this_00,local_48,buf,local_34,in_stack_00000008,(storage_error *)this,
                     in_stack_ffffffffffffff90);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

int posix_storage::write(settings_interface const&
		, span<char const> buffer
		, piece_index_t const piece, int const offset
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_WRITE
		std::this_thread::sleep_for(milliseconds(rand() % 800));
#endif
		return readwrite(files(), buffer, piece, offset, error
			, [this](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
			{
				// writing to a pad-file is a no-op
				return int(buf.size());
			}

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				TORRENT_ASSERT(m_part_file);

				error_code e;
				peer_request map = files().map_file(file_index
					, file_offset, 0);
				int const ret = m_part_file->write(buf, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_write;
				}
				return ret;
			}

			file_pointer const f = open_file(file_index, open_mode::write
				, file_offset, ec);
			if (ec.ec) return -1;

			// set this unconditionally in case the upper layer would like to treat
			// short reads as errors
			ec.operation = operation_t::file_write;

			int ret = 0;
			auto const r = static_cast<int>(std::fwrite(buf.data(), 1
				, static_cast<std::size_t>(buf.size()), f.file()));
			if (r != buf.size())
			{
				if (std::ferror(f.file())) ec.ec.assign(errno, generic_category());
				else ec.ec.assign(errors::file_too_short, libtorrent_category());
			}
			ret += r;

			// invalidate our stat cache for this file, since
			// we're writing to it
			m_stat_cache.set_dirty(file_index);
			return ret;
		});
	}